

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseTranslator.cpp
# Opt level: O3

void __thiscall InverseTranslator::InverseTranslator(InverseTranslator *this)

{
  (this->super_Translator)._vptr_Translator = (_func_int **)&PTR_translate_00107d38;
  (this->vowels)._M_dataplus._M_p = (pointer)&(this->vowels).field_2;
  (this->vowels)._M_string_length = 0;
  (this->vowels).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)&this->vowels,0,(char *)0x0,0x10604a);
  return;
}

Assistant:

InverseTranslator::InverseTranslator(){
  //vowels = {'a', 'e', 'i', 'o', 'u', 'y'}
  vowels = "aeiouyAEIOUY";
}